

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O0

EStatusCode __thiscall
ShadingWriter::WriteLinearShadingPatternObject
          (ShadingWriter *this,double inX0,double inY0,double inX1,double inY1,
          InterpretedGradientStopList *inColorLine,FT_PaintExtend inGradientExtend,
          PDFRectangle *inBounds,PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  bool bVar1;
  undefined1 local_a0 [8];
  LinearShading linearParams;
  ObjectIDType inPatternObjectId_local;
  PDFMatrix *inMatrix_local;
  PDFRectangle *inBounds_local;
  FT_PaintExtend inGradientExtend_local;
  InterpretedGradientStopList *inColorLine_local;
  double inY1_local;
  double inX1_local;
  double inY0_local;
  double inX0_local;
  ShadingWriter *this_local;
  
  local_a0 = (undefined1  [8])inX0;
  linearParams.x0 = inY0;
  linearParams.y0 = inX1;
  linearParams.x1 = inY1;
  linearParams._56_8_ = inPatternObjectId;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::list
            ((list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_> *)
             &linearParams.y1,inColorLine);
  linearParams.colorLine.
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node._M_size._0_4_ = inGradientExtend;
  bVar1 = ColorLineHasTransparency(this,inColorLine);
  if (bVar1) {
    this_local._4_4_ =
         WriteRGBATiledPatternObject
                   (this,(LinearShading *)local_a0,inBounds,inMatrix,linearParams._56_8_);
  }
  else {
    this_local._4_4_ =
         WriteRGBShadingPatternObject
                   (this,(LinearShading *)local_a0,inBounds,inMatrix,linearParams._56_8_);
  }
  LinearShading::~LinearShading((LinearShading *)local_a0);
  return this_local._4_4_;
}

Assistant:

EStatusCode ShadingWriter::WriteLinearShadingPatternObject(
    double inX0,
    double inY0,
    double inX1,
    double inY1,
    const InterpretedGradientStopList& inColorLine,
    FT_PaintExtend inGradientExtend,
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId
) {
    LinearShading linearParams = {
        inX0,
        inY0,
        inX1,
        inY1,
        inColorLine,
        inGradientExtend
    };

    if(ColorLineHasTransparency(inColorLine))
        return WriteRGBATiledPatternObject(linearParams, inBounds, inMatrix, inPatternObjectId);
    else
        return WriteRGBShadingPatternObject(linearParams, inBounds, inMatrix, inPatternObjectId);

}